

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

QString * __thiscall
VcprojGenerator::firstExpandedOutputFileName
          (QString *__return_storage_ptr__,VcprojGenerator *this,ProString *extraCompilerName)

{
  QMakeProject *this_00;
  long in_FS_OFFSET;
  ProString firstOutput;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  ProString local_98;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.m_file = -0x55555556;
  local_68._36_4_ = 0xaaaaaaaa;
  local_68.m_hash = 0xaaaaaaaaaaaaaaaa;
  local_68.m_string.d.size = -0x5555555555555556;
  local_68.m_offset = -0x55555556;
  local_68.m_length = -0x55555556;
  local_68.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  local_b0.ptr = L".output";
  local_b0.d = (Data *)extraCompilerName;
  ProString::ProString<ProString_const&,char_const(&)[8]>
            (&local_98,(QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)&local_b0);
  QMakeEvaluator::first(&local_68,&this_00->super_QMakeEvaluator,(ProKey *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  ProString::toQString((QString *)&local_b0,&local_68);
  firstInputFileName(&local_98,this,extraCompilerName);
  ProString::toQString((QString *)&local_c8,&local_98);
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char16_t *)0x0;
  local_e8.size = 0;
  MakefileGenerator::replaceExtraCompilerVariables
            (__return_storage_ptr__,(MakefileGenerator *)this,(QString *)&local_b0,
             (QString *)&local_c8,(QString *)&local_e8,NoShell);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString VcprojGenerator::firstExpandedOutputFileName(const ProString &extraCompilerName)
{
    const ProString firstOutput = project->first(ProKey(extraCompilerName + ".output"));
    return replaceExtraCompilerVariables(firstOutput.toQString(),
                                         firstInputFileName(extraCompilerName).toQString(),
                                         QString(), NoShell);
}